

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_impl.h
# Opt level: O0

level_enum __thiscall spdlog::logger::level(logger *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(level_enum *)(in_RDI + 0x40);
}

Assistant:

inline spdlog::level::level_enum spdlog::logger::level() const
{
    return static_cast<spdlog::level::level_enum>(level_.load(std::memory_order_relaxed));
}